

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

UChar32 utf16BEIteratorPrevious(UCharIterator *iter)

{
  UChar32 UVar1;
  int index;
  
  if (iter->start < iter->index) {
    index = iter->index + -1;
    iter->index = index;
    UVar1 = utf16BEIteratorGet(iter,index);
    return UVar1;
  }
  return -1;
}

Assistant:

static UChar32 U_CALLCONV
utf16BEIteratorPrevious(UCharIterator *iter) {
    int32_t index;

    if((index=iter->index)>iter->start) {
        iter->index=--index;
        return utf16BEIteratorGet(iter, index);
    } else {
        return U_SENTINEL;
    }
}